

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<btConvexHullInternal::Point32>::resize
          (btAlignedObjectArray<btConvexHullInternal::Point32> *this,int newsize,Point32 *fillData)

{
  undefined8 uVar1;
  int iVar2;
  Point32 *pPVar3;
  undefined8 *in_RDX;
  int in_ESI;
  btAlignedObjectArray<btConvexHullInternal::Point32> *in_RDI;
  int i_1;
  int i;
  int curSize;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  
  iVar2 = size(in_RDI);
  iVar4 = in_ESI;
  if (in_ESI < iVar2) {
    for (; iVar4 < iVar2; iVar4 = iVar4 + 1) {
    }
  }
  else {
    if (iVar2 < in_ESI) {
      reserve((btAlignedObjectArray<btConvexHullInternal::Point32> *)
              CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    }
    for (; iVar2 < in_ESI; iVar2 = iVar2 + 1) {
      pPVar3 = in_RDI->m_data + iVar2;
      uVar1 = *in_RDX;
      pPVar3->x = (int)uVar1;
      pPVar3->y = (int)((ulong)uVar1 >> 0x20);
      uVar1 = in_RDX[1];
      pPVar3->z = (int)uVar1;
      pPVar3->index = (int)((ulong)uVar1 >> 0x20);
    }
  }
  in_RDI->m_size = in_ESI;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void	resize(int newsize, const T& fillData=T())
		{
			const BT_REGISTER int curSize = size();

			if (newsize < curSize)
			{
				for(int i = newsize; i < curSize; i++)
				{
					m_data[i].~T();
				}
			} else
			{
				if (newsize > curSize)
				{
					reserve(newsize);
				}
#ifdef BT_USE_PLACEMENT_NEW
				for (int i=curSize;i<newsize;i++)
				{
					new ( &m_data[i]) T(fillData);
				}
#endif //BT_USE_PLACEMENT_NEW

			}

			m_size = newsize;
		}